

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *
__thiscall
ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>::
operator>>(ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>
           *this,uchar *obj)

{
  CSHA256 *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj_1;
  uchar local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(CSHA256 **)(*(long *)(this + 8) + 8);
  AutoFile::read(*(AutoFile **)this_00[1].s,(int)&local_29,(void *)0x1,in_RCX);
  CSHA256::Write(this_00,&local_29,1);
  *obj = local_29;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
            *)this;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream& operator>>(U&& obj) { ::Unserialize(*this, obj); return *this; }